

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::Runner2::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner2 *this,Runner *context,TestCaseFilters *filterGroup
          )

{
  TestCaseInfo *pTVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  long lVar7;
  iterator iVar8;
  ostream *poVar9;
  TestCaseInfo *testCase;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  Totals local_60;
  Totals *local_40;
  Runner *local_38;
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  local_38 = context;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar4));
  testCase = (TestCaseInfo *)*plVar6;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  pTVar1 = *(TestCaseInfo **)(lVar7 + 8);
  local_68 = (__return_storage_ptr__->assertions).passed;
  if (testCase == pTVar1) {
    (__return_storage_ptr__->assertions).passed = local_68;
  }
  else {
    local_80 = (__return_storage_ptr__->assertions).failed;
    local_78 = (__return_storage_ptr__->testCases).passed;
    local_70 = (__return_storage_ptr__->testCases).failed;
    iVar4 = 0;
    local_40 = __return_storage_ptr__;
    do {
      bVar3 = TestCaseFilters::shouldInclude(filterGroup,testCase);
      if (bVar3) {
        iVar4 = iVar4 + 1;
        iVar8 = std::
                _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
                ::find(&(this->m_testsAlreadyRun)._M_t,testCase);
        if ((_Rb_tree_header *)iVar8._M_node ==
            &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
          if ((local_38->m_totals).assertions.failed == (long)(local_38->m_config->m_data).cutoff)
          break;
          Runner::runTest(&local_60,local_38,testCase);
          local_68 = local_68 + local_60.assertions.passed;
          local_80 = local_80 + local_60.assertions.failed;
          local_78 = local_78 + local_60.testCases.passed;
          local_70 = local_70 + local_60.testCases.failed;
          std::
          _Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
          ::_M_insert_unique<Catch::TestCaseInfo_const&>
                    ((_Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
                      *)&this->m_testsAlreadyRun,testCase);
        }
      }
      testCase = testCase + 1;
    } while (testCase != pTVar1);
    (local_40->assertions).failed = local_80;
    (local_40->testCases).passed = local_78;
    (local_40->testCases).failed = local_70;
    (local_40->assertions).passed = local_68;
    __return_storage_ptr__ = local_40;
    if (iVar4 != 0) {
      return local_40;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\n[No test cases matched with: ",0x1e);
  pcVar2 = (filterGroup->m_name)._M_dataplus._M_p;
  local_60.assertions.passed = (size_t)&local_60.testCases;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (filterGroup->m_name)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_60.assertions.passed,
                      local_60.assertions.failed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((Counts *)local_60.assertions.passed != &local_60.testCases) {
    operator_delete((void *)local_60.assertions.passed,local_60.testCases.passed + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( Runner& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 )
                std::cerr << "\n[No test cases matched with: " << filterGroup.getName() << "]" << std::endl;
            return totals;

        }